

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_color_fv(float *c,nk_color in)

{
  *c = (float)((uint)in & 0xff) * 0.003921569;
  c[1] = (float)((uint)in >> 8 & 0xff) * 0.003921569;
  c[2] = (float)((uint)in >> 0x10 & 0xff) * 0.003921569;
  c[3] = (float)((uint)in >> 0x18) * 0.003921569;
  return;
}

Assistant:

NK_API void
nk_color_fv(float *c, struct nk_color in)
{
    nk_color_f(&c[0], &c[1], &c[2], &c[3], in);
}